

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void Assimp::OpenGEX::getRefNames
               (DDLNode *node,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  Text *pTVar1;
  Reference *pRVar2;
  size_t sVar3;
  ulong uVar4;
  string name;
  allocator local_51;
  value_type local_50;
  
  if (node != (DDLNode *)0x0) {
    pRVar2 = ODDLParser::DDLNode::getReferences(node);
    if ((pRVar2 != (Reference *)0x0) && (sVar3 = pRVar2->m_numRefs, sVar3 != 0)) {
      uVar4 = 0;
      do {
        if ((pRVar2->m_referencedName[uVar4] != (Name *)0x0) &&
           (pTVar1 = pRVar2->m_referencedName[uVar4]->m_id, pTVar1 != (Text *)0x0)) {
          std::__cxx11::string::string((string *)&local_50,pTVar1->m_buffer,&local_51);
          if (local_50._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(names,&local_50);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          sVar3 = pRVar2->m_numRefs;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < sVar3);
    }
    return;
  }
  __assert_fail("nullptr != node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                ,0x1f2,"void Assimp::OpenGEX::getRefNames(DDLNode *, std::vector<std::string> &)");
}

Assistant:

static void getRefNames( DDLNode *node, std::vector<std::string> &names ) {
    ai_assert( nullptr != node );

    Reference *ref = node->getReferences();
    if( nullptr != ref ) {
        for( size_t i = 0; i < ref->m_numRefs; i++ )  {
            Name *currentName( ref->m_referencedName[ i ] );
            if( nullptr != currentName && nullptr != currentName->m_id ) {
#ifdef ASSIMP_USE_HUNTER
                const std::string name( currentName->m_id->m_text.m_buffer );
#else
                const std::string name( currentName->m_id->m_buffer );
#endif
                if( !name.empty() ) {
                    names.push_back( name );
                }
            }
        }
    }
}